

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O0

string * __thiscall
QPDFEFStreamObjectHelper::getChecksum_abi_cxx11_
          (string *__return_storage_ptr__,QPDFEFStreamObjectHelper *this)

{
  bool bVar1;
  allocator<char> local_61;
  undefined4 local_60;
  allocator<char> local_49;
  string local_48 [32];
  QPDFObjectHandle val;
  QPDFEFStreamObjectHelper *this_local;
  
  val.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"/CheckSum",&local_49);
  getParam((QPDFEFStreamObjectHelper *)&stack0xffffffffffffffd8,(string *)this);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  bVar1 = QPDFObjectHandle::isString((QPDFObjectHandle *)&stack0xffffffffffffffd8);
  if (bVar1) {
    QPDFObjectHandle::getStringValue_abi_cxx11_
              (__return_storage_ptr__,(QPDFObjectHandle *)&stack0xffffffffffffffd8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_61);
    std::allocator<char>::~allocator(&local_61);
  }
  local_60 = 1;
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffd8);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFEFStreamObjectHelper::getChecksum()
{
    auto val = getParam("/CheckSum");
    if (val.isString()) {
        return val.getStringValue();
    }
    return "";
}